

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  LogMessage *pLVar4;
  RepeatedFieldAccessor *pRVar5;
  undefined1 *puVar6;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (*(int *)(field + 0x3c) != 3) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x29e);
    pLVar4 = internal::LogMessage::operator<<(&local_48,"CHECK failed: field->is_repeated(): ");
    internal::LogFinisher::operator=(&local_49,pLVar4);
    internal::LogMessage::~LogMessage(&local_48);
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    return (RepeatedFieldAccessor *)
           &anon_unknown_0::
            GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>_>::
            singleton;
  case CPPTYPE_INT64:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::singleton
        != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::singleton =
         &PTR_IsEmpty_0060cf38;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>()::
              singleton;
    break;
  case CPPTYPE_UINT32:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
              ::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()::
        singleton != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()::
    singleton = &PTR_IsEmpty_0060ce68;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>()
              ::singleton;
    break;
  case CPPTYPE_UINT64:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
              ::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()::
        singleton != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()::
    singleton = &PTR_IsEmpty_0060d008;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>()
              ::singleton;
    break;
  case CPPTYPE_DOUBLE:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
        singleton != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::singleton =
         &PTR_IsEmpty_0060d1a8;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>()::
              singleton;
    break;
  case CPPTYPE_FLOAT:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::singleton
        != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::singleton =
         &PTR_IsEmpty_0060d0d8;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>()::
              singleton;
    break;
  case CPPTYPE_BOOL:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
              singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::singleton
        != '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::singleton =
         &PTR_IsEmpty_0060d278;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>()::
              singleton;
    break;
  case CPPTYPE_STRING:
    pRVar5 = (RepeatedFieldAccessor *)
             &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    if ((anonymous_namespace)::
        GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton !=
        '\0') {
      return pRVar5;
    }
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()
                                 ::singleton);
    if (iVar3 == 0) {
      return pRVar5;
    }
    (anonymous_namespace)::
    GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton =
         &PTR_IsEmpty_0060d348;
    puVar6 = &(anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>()::singleton;
    break;
  case CPPTYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_map(field);
    if (bVar1) {
      pRVar5 = (RepeatedFieldAccessor *)
               &(anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()
                ::singleton;
      if ((anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
          singleton != '\0') {
        return pRVar5;
      }
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::MapFieldAccessor>()::
                                   singleton);
      if (iVar3 == 0) {
        return pRVar5;
      }
      (anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()::singleton
           = &PTR_IsEmpty_0060d420;
      puVar6 = &(anonymous_namespace)::GetSingleton<google::protobuf::internal::MapFieldAccessor>()
                ::singleton;
    }
    else {
      pRVar5 = (RepeatedFieldAccessor *)
               &(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
      if ((anonymous_namespace)::
          GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton !=
          '\0') {
        return pRVar5;
      }
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()
                                   ::singleton);
      if (iVar3 == 0) {
        return pRVar5;
      }
      (anonymous_namespace)::
      GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::singleton =
           &PTR_IsEmpty_0060d4f0;
      puVar6 = &(anonymous_namespace)::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>()::
                singleton;
    }
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x2ba);
    pLVar4 = internal::LogMessage::operator<<(&local_48,"Should not reach here.");
    internal::LogFinisher::operator=(&local_49,pLVar4);
    internal::LogMessage::~LogMessage(&local_48);
    return (RepeatedFieldAccessor *)0x0;
  }
  __cxa_guard_release(puVar6);
  return pRVar5;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32)
    HANDLE_PRIMITIVE_TYPE(INT64, int64)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->options().ctype()) {
        default:
        case FieldOptions::STRING:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  GOOGLE_LOG(FATAL) << "Should not reach here.";
  return NULL;
}